

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O0

int32_t __thiscall icu_63::BMPSet::findCodePoint(BMPSet *this,UChar32 c,int32_t lo,int32_t hi)

{
  int32_t iVar1;
  int local_24;
  int32_t i;
  int32_t hi_local;
  int32_t lo_local;
  UChar32 c_local;
  BMPSet *this_local;
  
  this_local._4_4_ = lo;
  if (((this->list[lo] <= c) && (this_local._4_4_ = hi, lo < hi)) &&
     (local_24 = hi, iVar1 = lo, c < this->list[hi + -1])) {
    while (i = iVar1, iVar1 = i + local_24 >> 1, iVar1 != i) {
      if (c < this->list[iVar1]) {
        local_24 = iVar1;
        iVar1 = i;
      }
    }
    this_local._4_4_ = local_24;
  }
  return this_local._4_4_;
}

Assistant:

int32_t BMPSet::findCodePoint(UChar32 c, int32_t lo, int32_t hi) const {
    /* Examples:
                                       findCodePoint(c)
       set              list[]         c=0 1 3 4 7 8
       ===              ==============   ===========
       []               [110000]         0 0 0 0 0 0
       [\u0000-\u0003]  [0, 4, 110000]   1 1 1 2 2 2
       [\u0004-\u0007]  [4, 8, 110000]   0 0 0 1 1 2
       [:Any:]          [0, 110000]      1 1 1 1 1 1
     */

    // Return the smallest i such that c < list[i].  Assume
    // list[len - 1] == HIGH and that c is legal (0..HIGH-1).
    if (c < list[lo])
        return lo;
    // High runner test.  c is often after the last range, so an
    // initial check for this condition pays off.
    if (lo >= hi || c >= list[hi-1])
        return hi;
    // invariant: c >= list[lo]
    // invariant: c < list[hi]
    for (;;) {
        int32_t i = (lo + hi) >> 1;
        if (i == lo) {
            break; // Found!
        } else if (c < list[i]) {
            hi = i;
        } else {
            lo = i;
        }
    }
    return hi;
}